

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast.cc
# Opt level: O3

t_operand __thiscall
xemmai::ast::t_try::f_emit(t_try *this,t_emit *a_emit,bool a_tail,bool a_operand,bool a_clear)

{
  ulong uVar1;
  t_targets *ptVar2;
  pointer puVar3;
  unique_ptr<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_> uVar4;
  t_variable *ptVar5;
  t_catch *ptVar6;
  pointer puVar7;
  t_node *ptVar8;
  t_block *ptVar9;
  bool a_clear_00;
  reference pvVar10;
  reference a_label;
  t_emit *ptVar11;
  t_block *ptVar12;
  t_label *ptVar13;
  t_label *ptVar14;
  t_label *ptVar15;
  size_t sVar16;
  anon_union_8_4_0f1077ea_for_t_operand_2 extraout_RDX;
  anon_union_8_4_0f1077ea_for_t_operand_2 extraout_RDX_00;
  anon_union_8_4_0f1077ea_for_t_operand_2 extraout_RDX_01;
  anon_union_8_4_0f1077ea_for_t_operand_2 extraout_RDX_02;
  anon_union_8_4_0f1077ea_for_t_operand_2 extraout_RDX_03;
  anon_union_8_4_0f1077ea_for_t_operand_2 aVar17;
  t_code *ptVar18;
  undefined7 in_register_00000081;
  unique_ptr<xemmai::ast::t_try::t_catch,_std::default_delete<xemmai::ast::t_try::t_catch>_> *p;
  pointer puVar19;
  pointer puVar20;
  const_iterator __end2;
  t_operand tVar21;
  size_t stack;
  anon_class_16_2_864c0342 operand;
  t_block *local_d8;
  t_try *local_d0;
  reference local_c8;
  t_targets *local_c0;
  undefined1 local_b8 [16];
  t_emit *local_a8;
  reference local_a0;
  reference local_98;
  reference local_90;
  undefined1 local_88 [24];
  pointer pptStack_70;
  t_label *local_68;
  t_block *ptStack_60;
  t_label *local_58;
  t_block *ptStack_50;
  t_block *local_48;
  ulong uStack_40;
  
  local_c8 = (reference)CONCAT44(local_c8._4_4_,(int)CONCAT71(in_register_00000081,a_clear));
  t_emit::f_join(a_emit,&this->v_junction_try);
  t_emit::f_merge(a_emit,&this->v_junction_try);
  ptVar12 = (t_block *)a_emit->v_stack;
  local_b8._0_8_ = ptVar12;
  local_b8._8_8_ = ptVar12;
  pvVar10 = std::deque<xemmai::t_emit::t_label,_std::allocator<xemmai::t_emit::t_label>_>::
            emplace_back<>(a_emit->v_labels);
  local_d0 = (t_try *)pvVar10;
  a_label = std::deque<xemmai::t_emit::t_label,_std::allocator<xemmai::t_emit::t_label>_>::
            emplace_back<>(a_emit->v_labels);
  local_88._0_8_ = t_code::v_labels[2];
  std::vector<void*,std::allocator<void*>>::emplace_back<void*>
            ((vector<void*,std::allocator<void*>> *)&a_emit->v_code->v_instructions,
             (void **)local_88);
  local_88._0_8_ = ptVar12;
  std::vector<void*,std::allocator<void*>>::emplace_back<void*>
            ((vector<void*,std::allocator<void*>> *)&a_emit->v_code->v_instructions,
             (void **)local_88);
  ptVar11 = t_emit::operator<<(a_emit,pvVar10);
  local_90 = a_label;
  t_emit::operator<<(ptVar11,a_label);
  ptVar2 = a_emit->v_targets;
  ptVar11 = (t_emit *)
            std::deque<xemmai::t_emit::t_label,_std::allocator<xemmai::t_emit::t_label>_>::
            emplace_back<>(a_emit->v_labels);
  pvVar10 = std::deque<xemmai::t_emit::t_label,_std::allocator<xemmai::t_emit::t_label>_>::
            emplace_back<>(a_emit->v_labels);
  local_98 = std::deque<xemmai::t_emit::t_label,_std::allocator<xemmai::t_emit::t_label>_>::
             emplace_back<>(a_emit->v_labels);
  local_88._0_8_ = ptVar11;
  if (ptVar2->v_break == (t_label *)0x0) {
    local_88._0_8_ = (t_emit *)0x0;
  }
  local_88._8_8_ = &this->v_junction_finally;
  local_88._16_8_ = local_b8._8_8_;
  pptStack_70 = (pointer)((ulong)CONCAT61(pptStack_70._2_6_,ptVar2->v_break_must_clear) << 8);
  local_68 = pvVar10;
  if (ptVar2->v_continue == (t_label *)0x0) {
    local_68 = (reference)0x0;
  }
  local_58 = local_98;
  if (ptVar2->v_return == (t_label *)0x0) {
    local_58 = (reference)0x0;
  }
  local_48 = (t_block *)local_b8._8_8_;
  uStack_40 = uStack_40 & 0xffffffffffffff00;
  a_emit->v_targets = (t_targets *)local_88;
  local_c0 = ptVar2;
  local_a8 = ptVar11;
  local_a0 = pvVar10;
  ptStack_60 = (t_block *)local_88._8_8_;
  ptStack_50 = (t_block *)local_88._8_8_;
  anon_unknown_11::f_emit_block
            ((anon_unknown_11 *)a_emit,
             (t_emit *)
             (this->v_block).
             super__Vector_base<std::unique_ptr<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_>,_std::allocator<std::unique_ptr<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start,
             (vector<std::unique_ptr<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_>,_std::allocator<std::unique_ptr<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_>_>_>
              *)(this->v_block).
                super__Vector_base<std::unique_ptr<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_>,_std::allocator<std::unique_ptr<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish,false,SUB81(local_c8,0),false);
  local_d8 = (t_block *)t_code::v_labels[4];
  std::vector<void*,std::allocator<void*>>::emplace_back<void*>
            ((vector<void*,std::allocator<void*>> *)&a_emit->v_code->v_instructions,&local_d8);
  local_d8 = (t_block *)0x1;
  std::vector<void*,std::allocator<void*>>::emplace_back<void*>
            ((vector<void*,std::allocator<void*>> *)&a_emit->v_code->v_instructions,&local_d8);
  ptVar18 = a_emit->v_code;
  *(long *)((long)local_d0 + 0x18) =
       (long)(ptVar18->v_instructions).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
             super__Vector_impl_data._M_finish -
       (long)(ptVar18->v_instructions).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
             super__Vector_impl_data._M_start >> 3;
  puVar19 = (this->v_catches).
            super__Vector_base<std::unique_ptr<xemmai::ast::t_try::t_catch,_std::default_delete<xemmai::ast::t_try::t_catch>_>,_std::allocator<std::unique_ptr<xemmai::ast::t_try::t_catch,_std::default_delete<xemmai::ast::t_try::t_catch>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  puVar3 = (this->v_catches).
           super__Vector_base<std::unique_ptr<xemmai::ast::t_try::t_catch,_std::default_delete<xemmai::ast::t_try::t_catch>_>,_std::allocator<std::unique_ptr<xemmai::ast::t_try::t_catch,_std::default_delete<xemmai::ast::t_try::t_catch>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  local_d0 = this;
  if (puVar19 != puVar3) {
    a_clear_00 = (bool)(char)local_c8;
    do {
      if ((char)local_c8 == '\0') {
        a_emit->v_stack = a_emit->v_stack - 1;
      }
      uVar4._M_t.
      super___uniq_ptr_impl<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_>._M_t.
      super__Tuple_impl<0UL,_xemmai::ast::t_node_*,_std::default_delete<xemmai::ast::t_node>_>.
      super__Head_base<0UL,_xemmai::ast::t_node_*,_false>._M_head_impl =
           (((puVar19->_M_t).
             super___uniq_ptr_impl<xemmai::ast::t_try::t_catch,_std::default_delete<xemmai::ast::t_try::t_catch>_>
             ._M_t.
             super__Tuple_impl<0UL,_xemmai::ast::t_try::t_catch_*,_std::default_delete<xemmai::ast::t_try::t_catch>_>
             .super__Head_base<0UL,_xemmai::ast::t_try::t_catch_*,_false>._M_head_impl)->
           v_expression)._M_t;
      (**(code **)(*(long *)uVar4._M_t.
                            super___uniq_ptr_impl<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_xemmai::ast::t_node_*,_std::default_delete<xemmai::ast::t_node>_>
                            .super__Head_base<0UL,_xemmai::ast::t_node_*,_false>._M_head_impl + 0x18
                  ))(uVar4._M_t.
                     super___uniq_ptr_impl<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_xemmai::ast::t_node_*,_std::default_delete<xemmai::ast::t_node>_>
                     .super__Head_base<0UL,_xemmai::ast::t_node_*,_false>._M_head_impl,a_emit,0,0,0)
      ;
      pvVar10 = std::deque<xemmai::t_emit::t_label,_std::allocator<xemmai::t_emit::t_label>_>::
                emplace_back<>(a_emit->v_labels);
      a_emit->v_stack = a_emit->v_stack - 1;
      local_d8 = (t_block *)t_code::v_labels[3];
      std::vector<void*,std::allocator<void*>>::emplace_back<void*>
                ((vector<void*,std::allocator<void*>> *)&a_emit->v_code->v_instructions,&local_d8);
      ptVar11 = t_emit::operator<<(a_emit,pvVar10);
      ptVar5 = ((puVar19->_M_t).
                super___uniq_ptr_impl<xemmai::ast::t_try::t_catch,_std::default_delete<xemmai::ast::t_try::t_catch>_>
                ._M_t.
                super__Tuple_impl<0UL,_xemmai::ast::t_try::t_catch_*,_std::default_delete<xemmai::ast::t_try::t_catch>_>
                .super__Head_base<0UL,_xemmai::ast::t_try::t_catch_*,_false>._M_head_impl)->
               v_variable;
      local_d8 = (t_block *)(-(ulong)ptVar5->v_shared ^ ptVar5->v_index);
      std::vector<void*,std::allocator<void*>>::emplace_back<void*>
                ((vector<void*,std::allocator<void*>> *)&ptVar11->v_code->v_instructions,&local_d8);
      ptVar6 = (puVar19->_M_t).
               super___uniq_ptr_impl<xemmai::ast::t_try::t_catch,_std::default_delete<xemmai::ast::t_try::t_catch>_>
               ._M_t.
               super__Tuple_impl<0UL,_xemmai::ast::t_try::t_catch_*,_std::default_delete<xemmai::ast::t_try::t_catch>_>
               .super__Head_base<0UL,_xemmai::ast::t_try::t_catch_*,_false>._M_head_impl;
      anon_unknown_11::f_emit_block
                ((anon_unknown_11 *)a_emit,
                 *(t_emit **)
                  &(ptVar6->v_block).
                   super__Vector_base<std::unique_ptr<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_>,_std::allocator<std::unique_ptr<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_>_>_>
                   ._M_impl,
                 (vector<std::unique_ptr<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_>,_std::allocator<std::unique_ptr<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_>_>_>
                  *)(ptVar6->v_block).
                    super__Vector_base<std::unique_ptr<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_>,_std::allocator<std::unique_ptr<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish,false,a_clear_00,false);
      local_d8 = (t_block *)t_code::v_labels[4];
      std::vector<void*,std::allocator<void*>>::emplace_back<void*>
                ((vector<void*,std::allocator<void*>> *)&a_emit->v_code->v_instructions,&local_d8);
      local_d8 = (t_block *)0x1;
      std::vector<void*,std::allocator<void*>>::emplace_back<void*>
                ((vector<void*,std::allocator<void*>> *)&a_emit->v_code->v_instructions,&local_d8);
      ptVar18 = a_emit->v_code;
      pvVar10->v_target =
           (long)(ptVar18->v_instructions).super__Vector_base<void_*,_std::allocator<void_*>_>.
                 _M_impl.super__Vector_impl_data._M_finish -
           (long)(ptVar18->v_instructions).super__Vector_base<void_*,_std::allocator<void_*>_>.
                 _M_impl.super__Vector_impl_data._M_start >> 3;
      puVar19 = puVar19 + 1;
    } while (puVar19 != puVar3);
  }
  local_d8 = (t_block *)t_code::v_labels[4];
  std::vector<void*,std::allocator<void*>>::emplace_back<void*>
            ((vector<void*,std::allocator<void*>> *)&ptVar18->v_instructions,&local_d8);
  local_d8 = (t_block *)0x5;
  std::vector<void*,std::allocator<void*>>::emplace_back<void*>
            ((vector<void*,std::allocator<void*>> *)&a_emit->v_code->v_instructions,&local_d8);
  ptVar18 = a_emit->v_code;
  local_a8->v_code =
       (t_code *)
       ((long)(ptVar18->v_instructions).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
              super__Vector_impl_data._M_finish -
        (long)(ptVar18->v_instructions).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
              super__Vector_impl_data._M_start >> 3);
  local_d8 = (t_block *)t_code::v_labels[4];
  std::vector<void*,std::allocator<void*>>::emplace_back<void*>
            ((vector<void*,std::allocator<void*>> *)&ptVar18->v_instructions,&local_d8);
  local_d8 = (t_block *)0x2;
  std::vector<void*,std::allocator<void*>>::emplace_back<void*>
            ((vector<void*,std::allocator<void*>> *)&a_emit->v_code->v_instructions,&local_d8);
  ptVar18 = a_emit->v_code;
  local_a0->v_target =
       (long)(ptVar18->v_instructions).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
             super__Vector_impl_data._M_finish -
       (long)(ptVar18->v_instructions).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
             super__Vector_impl_data._M_start >> 3;
  local_d8 = (t_block *)t_code::v_labels[4];
  std::vector<void*,std::allocator<void*>>::emplace_back<void*>
            ((vector<void*,std::allocator<void*>> *)&ptVar18->v_instructions,&local_d8);
  local_d8 = (t_block *)0x3;
  std::vector<void*,std::allocator<void*>>::emplace_back<void*>
            ((vector<void*,std::allocator<void*>> *)&a_emit->v_code->v_instructions,&local_d8);
  ptVar18 = a_emit->v_code;
  local_98->v_target =
       (long)(ptVar18->v_instructions).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
             super__Vector_impl_data._M_finish -
       (long)(ptVar18->v_instructions).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
             super__Vector_impl_data._M_start >> 3;
  local_d8 = (t_block *)t_code::v_labels[4];
  std::vector<void*,std::allocator<void*>>::emplace_back<void*>
            ((vector<void*,std::allocator<void*>> *)&ptVar18->v_instructions,&local_d8);
  local_d8 = (t_block *)0x4;
  std::vector<void*,std::allocator<void*>>::emplace_back<void*>
            ((vector<void*,std::allocator<void*>> *)&a_emit->v_code->v_instructions,&local_d8);
  ptVar18 = a_emit->v_code;
  local_90->v_target =
       (long)(ptVar18->v_instructions).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
             super__Vector_impl_data._M_finish -
       (long)(ptVar18->v_instructions).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
             super__Vector_impl_data._M_start >> 3;
  local_48 = (t_block *)0x0;
  uStack_40 = 0;
  local_58 = (t_label *)0x0;
  ptStack_50 = (t_block *)0x0;
  local_68 = (t_label *)0x0;
  ptStack_60 = (t_block *)0x0;
  local_88._16_8_ = (pointer)0x0;
  pptStack_70 = (pointer)0x0;
  local_88._0_8_ = (t_emit *)0x0;
  local_88._8_8_ = (t_block *)0x0;
  a_emit->v_targets = (t_targets *)local_88;
  if ((char)local_c8 == '\0') {
    puVar7 = (local_d0->v_finally).
             super__Vector_base<std::unique_ptr<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_>,_std::allocator<std::unique_ptr<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (puVar20 = (local_d0->v_finally).
                   super__Vector_base<std::unique_ptr<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_>,_std::allocator<std::unique_ptr<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start; puVar20 != puVar7;
        puVar20 = puVar20 + 1) {
      ptVar8 = (puVar20->_M_t).
               super___uniq_ptr_impl<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_>
               ._M_t.
               super__Tuple_impl<0UL,_xemmai::ast::t_node_*,_std::default_delete<xemmai::ast::t_node>_>
               .super__Head_base<0UL,_xemmai::ast::t_node_*,_false>._M_head_impl;
      (*ptVar8->_vptr_t_node[3])(ptVar8,a_emit,0,0,1);
    }
  }
  else {
    sVar16 = a_emit->v_stack;
    uVar1 = sVar16 + 1;
    a_emit->v_stack = uVar1;
    if (ptVar18->v_size < uVar1) {
      ptVar18->v_size = uVar1;
    }
    puVar20 = (local_d0->v_finally).
              super__Vector_base<std::unique_ptr<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_>,_std::allocator<std::unique_ptr<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    puVar7 = (local_d0->v_finally).
             super__Vector_base<std::unique_ptr<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_>,_std::allocator<std::unique_ptr<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (puVar20 != puVar7) {
      do {
        ptVar8 = (puVar20->_M_t).
                 super___uniq_ptr_impl<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_xemmai::ast::t_node_*,_std::default_delete<xemmai::ast::t_node>_>
                 .super__Head_base<0UL,_xemmai::ast::t_node_*,_false>._M_head_impl;
        (*ptVar8->_vptr_t_node[3])(ptVar8,a_emit,0,0,1);
        puVar20 = puVar20 + 1;
      } while (puVar20 != puVar7);
      sVar16 = a_emit->v_stack - 1;
    }
    a_emit->v_stack = sVar16;
  }
  local_88._0_8_ = t_code::v_labels[5];
  std::vector<void*,std::allocator<void*>>::emplace_back<void*>
            ((vector<void*,std::allocator<void*>> *)&a_emit->v_code->v_instructions,
             (void **)local_88);
  ptVar2 = local_c0;
  local_88._0_8_ = a_emit;
  local_88._8_8_ = (t_block *)local_b8;
  ptVar12 = (t_block *)&local_c0->v_break_stack;
  if (local_c0->v_break_must_clear != false) {
    ptVar12 = (t_block *)local_b8;
  }
  ptVar12 = ptVar12->v_queue;
  ptVar13 = f_emit::anon_class_16_2_864c0342::operator()
                      ((anon_class_16_2_864c0342 *)local_88,local_c0->v_break,
                       local_c0->v_break_junction,(size_t)ptVar12);
  ptVar14 = f_emit::anon_class_16_2_864c0342::operator()
                      ((anon_class_16_2_864c0342 *)local_88,ptVar2->v_continue,
                       ptVar2->v_continue_junction,local_b8._0_8_);
  ptVar15 = f_emit::anon_class_16_2_864c0342::operator()
                      ((anon_class_16_2_864c0342 *)local_88,ptVar2->v_return,
                       ptVar2->v_return_junction,ptVar2->v_return_stack);
  aVar17 = extraout_RDX;
  if ((ptVar13 != (t_label *)0x0 || ptVar14 != (t_label *)0x0) || ptVar15 != (t_label *)0x0) {
    pvVar10 = std::deque<xemmai::t_emit::t_label,_std::allocator<xemmai::t_emit::t_label>_>::
              emplace_back<>(a_emit->v_labels);
    local_d8 = (t_block *)*t_code::v_labels;
    std::vector<void*,std::allocator<void*>>::emplace_back<void*>
              ((vector<void*,std::allocator<void*>> *)&a_emit->v_code->v_instructions,&local_d8);
    local_c8 = pvVar10;
    t_emit::operator<<(a_emit,pvVar10);
    aVar17 = extraout_RDX_00;
    if (ptVar13 != (t_label *)0x0) {
      local_d0 = (t_try *)local_c0->v_break;
      ptVar9 = local_c0->v_break_junction;
      ptVar18 = a_emit->v_code;
      ptVar13->v_target =
           (long)(ptVar18->v_instructions).super__Vector_base<void_*,_std::allocator<void_*>_>.
                 _M_impl.super__Vector_impl_data._M_finish -
           (long)(ptVar18->v_instructions).super__Vector_base<void_*,_std::allocator<void_*>_>.
                 _M_impl.super__Vector_impl_data._M_start >> 3;
      if (ptVar12 < (ulong)local_b8._0_8_) {
        local_d8 = (t_block *)t_code::v_labels[0x10];
        std::vector<void*,std::allocator<void*>>::emplace_back<void*>
                  ((vector<void*,std::allocator<void*>> *)&ptVar18->v_instructions,&local_d8);
        local_d8 = ptVar12;
        std::vector<void*,std::allocator<void*>>::emplace_back<void*>
                  ((vector<void*,std::allocator<void*>> *)&a_emit->v_code->v_instructions,&local_d8)
        ;
        local_d8 = (t_block *)local_b8._0_8_;
        std::vector<void*,std::allocator<void*>>::emplace_back<void*>
                  ((vector<void*,std::allocator<void*>> *)&a_emit->v_code->v_instructions,&local_d8)
        ;
      }
      t_emit::f_join(a_emit,ptVar9);
      local_d8 = (t_block *)*t_code::v_labels;
      std::vector<void*,std::allocator<void*>>::emplace_back<void*>
                ((vector<void*,std::allocator<void*>> *)&a_emit->v_code->v_instructions,&local_d8);
      t_emit::operator<<(a_emit,(t_label *)local_d0);
      aVar17 = extraout_RDX_01;
    }
    if (ptVar14 != (t_label *)0x0) {
      ptVar13 = local_c0->v_continue;
      ptVar12 = local_c0->v_continue_junction;
      ptVar14->v_target =
           (long)(a_emit->v_code->v_instructions).
                 super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.super__Vector_impl_data
                 ._M_finish -
           (long)(a_emit->v_code->v_instructions).
                 super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.super__Vector_impl_data
                 ._M_start >> 3;
      t_emit::f_join(a_emit,ptVar12);
      local_d8 = (t_block *)*t_code::v_labels;
      std::vector<void*,std::allocator<void*>>::emplace_back<void*>
                ((vector<void*,std::allocator<void*>> *)&a_emit->v_code->v_instructions,&local_d8);
      t_emit::operator<<(a_emit,ptVar13);
      aVar17 = extraout_RDX_02;
    }
    if (ptVar15 != (t_label *)0x0) {
      ptVar13 = local_c0->v_return;
      ptVar12 = local_c0->v_return_junction;
      ptVar9 = (t_block *)local_c0->v_return_stack;
      ptVar18 = a_emit->v_code;
      ptVar15->v_target =
           (long)(ptVar18->v_instructions).super__Vector_base<void_*,_std::allocator<void_*>_>.
                 _M_impl.super__Vector_impl_data._M_finish -
           (long)(ptVar18->v_instructions).super__Vector_base<void_*,_std::allocator<void_*>_>.
                 _M_impl.super__Vector_impl_data._M_start >> 3;
      if (ptVar9 < (ulong)local_b8._0_8_) {
        local_d8 = (t_block *)t_code::v_labels[0x10];
        std::vector<void*,std::allocator<void*>>::emplace_back<void*>
                  ((vector<void*,std::allocator<void*>> *)&ptVar18->v_instructions,&local_d8);
        local_d8 = ptVar9;
        std::vector<void*,std::allocator<void*>>::emplace_back<void*>
                  ((vector<void*,std::allocator<void*>> *)&a_emit->v_code->v_instructions,&local_d8)
        ;
        local_d8 = (t_block *)local_b8._0_8_;
        std::vector<void*,std::allocator<void*>>::emplace_back<void*>
                  ((vector<void*,std::allocator<void*>> *)&a_emit->v_code->v_instructions,&local_d8)
        ;
      }
      t_emit::f_join(a_emit,ptVar12);
      local_d8 = (t_block *)*t_code::v_labels;
      std::vector<void*,std::allocator<void*>>::emplace_back<void*>
                ((vector<void*,std::allocator<void*>> *)&a_emit->v_code->v_instructions,&local_d8);
      t_emit::operator<<(a_emit,ptVar13);
      aVar17 = extraout_RDX_03;
    }
    local_c8->v_target =
         (long)(a_emit->v_code->v_instructions).super__Vector_base<void_*,_std::allocator<void_*>_>.
               _M_impl.super__Vector_impl_data._M_finish -
         (long)(a_emit->v_code->v_instructions).super__Vector_base<void_*,_std::allocator<void_*>_>.
               _M_impl.super__Vector_impl_data._M_start >> 3;
  }
  a_emit->v_targets = local_c0;
  tVar21.field_1.v_integer = aVar17.v_integer;
  tVar21._0_8_ = 4;
  return tVar21;
}

Assistant:

t_operand t_try::f_emit(t_emit& a_emit, bool a_tail, bool a_operand, bool a_clear)
{
	a_emit.f_join(v_junction_try);
	a_emit.f_merge(v_junction_try);
	auto stack = a_emit.v_stack;
	auto& catch0 = a_emit.f_label();
	auto& finally0 = a_emit.f_label();
	a_emit << c_instruction__TRY << stack << catch0 << finally0;
	auto targets0 = a_emit.v_targets;
	{
		auto& break0 = a_emit.f_label();
		auto& continue0 = a_emit.f_label();
		auto& return0 = a_emit.f_label();
		t_emit::t_targets targets1{targets0->v_break ? &break0 : nullptr, &v_junction_finally, stack, false, targets0->v_break_must_clear, targets0->v_continue ? &continue0 : nullptr, &v_junction_finally, targets0->v_return ? &return0 : nullptr, &v_junction_finally, stack, false};
		a_emit.v_targets = &targets1;
		f_emit_block(a_emit, v_block, false, a_clear);
		a_emit << c_instruction__FINALLY << t_code::c_try__STEP;
		a_emit.f_target(catch0);
		for (auto& p : v_catches) {
			if (!a_clear) a_emit.f_pop();
			p->v_expression->f_emit(a_emit, false, false);
			auto& label0 = a_emit.f_label();
			a_emit.f_pop() << c_instruction__CATCH << label0 << (p->v_variable.v_shared ? ~p->v_variable.v_index : p->v_variable.v_index);
			f_emit_block(a_emit, p->v_block, false, a_clear);
			a_emit << c_instruction__FINALLY << t_code::c_try__STEP;
			a_emit.f_target(label0);
		}
		a_emit << c_instruction__FINALLY << t_code::c_try__THROW;
		a_emit.f_target(break0);
		a_emit << c_instruction__FINALLY << t_code::c_try__BREAK;
		a_emit.f_target(continue0);
		a_emit << c_instruction__FINALLY << t_code::c_try__CONTINUE;
		a_emit.f_target(return0);
		a_emit << c_instruction__FINALLY << t_code::c_try__RETURN;
	}
	a_emit.f_target(finally0);
	{
		t_emit::t_targets targets2{nullptr, nullptr, 0, false, false, nullptr, nullptr, nullptr, nullptr, 0, false};
		a_emit.v_targets = &targets2;
		if (a_clear) a_emit.f_push();
		f_emit_block_without_value(a_emit, v_finally);
		if (a_clear) a_emit.f_pop();
	}
	a_emit << c_instruction__YRT;
	auto operand = [&](t_emit::t_label* a_label, t_block* a_junction, size_t a_stack) -> t_emit::t_label*
	{
		if (!a_label) {
			a_emit << size_t(0);
			return nullptr;
		}
		auto jump = [&]
		{
			auto label = &a_emit.f_label();
			a_emit << *label;
			return label;
		};
		if (stack > a_stack) return jump();
		for (size_t i = 0; i < a_junction->v_privates.size(); ++i) {
			if ((*a_emit.v_privates)[i]) continue;
			auto& x = a_junction->v_privates[i];
			if (x.v_use && x.v_in) return jump();
		}
		a_emit << *a_label;
		return nullptr;
	};
	auto break_stack = targets0->v_break_must_clear ? stack : targets0->v_break_stack;
	auto break0 = operand(targets0->v_break, targets0->v_break_junction, break_stack);
	auto continue0 = operand(targets0->v_continue, targets0->v_continue_junction, stack);
	auto return0 = operand(targets0->v_return, targets0->v_return_junction, targets0->v_return_stack);
	auto step = break0 || continue0 || return0 ? &a_emit.f_label() : nullptr;
	if (step) a_emit << c_instruction__JUMP << *step;
	auto join = [&](t_emit::t_label* a_label0, t_emit::t_label* a_label1, t_block* a_junction, size_t a_stack)
	{
		if (!a_label0) return;
		a_emit.f_target(*a_label0);
		if (stack > a_stack) a_emit << c_instruction__STACK_GET << a_stack << stack;
		a_emit.f_join(*a_junction);
		a_emit << c_instruction__JUMP << *a_label1;
	};
	join(break0, targets0->v_break, targets0->v_break_junction, break_stack);
	join(continue0, targets0->v_continue, targets0->v_continue_junction, stack);
	join(return0, targets0->v_return, targets0->v_return_junction, targets0->v_return_stack);
	if (step) a_emit.f_target(*step);
	a_emit.v_targets = targets0;
	return {};
}